

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::Init(Instr *this,OpCode opcode,IRKind kind,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Func *func_local;
  IRKind kind_local;
  OpCode opcode_local;
  Instr *this_local;
  
  bVar2 = OpCodeAttr::ByteCodeOnly(opcode);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd,"(!OpCodeAttr::ByteCodeOnly(opcode))",
                       "!OpCodeAttr::ByteCodeOnly(opcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->m_opcode = opcode;
  this->m_kind = kind;
  this->m_func = func;
  this->bailOutByteCodeLocation = 0xffffffff;
  return;
}

Assistant:

void
Instr::Init(Js::OpCode opcode, IRKind kind, Func * func)
{
    Assert(!OpCodeAttr::ByteCodeOnly(opcode));
    this->m_opcode = opcode;
    this->m_kind = kind;
    this->m_func = func;
#ifdef BAILOUT_INJECTION
    this->bailOutByteCodeLocation = (uint)-1;
#endif
}